

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall ot::commissioner::coap::Coap::HandleResponse(Coap *this,Response *aResponse)

{
  undefined8 uVar1;
  bool bVar2;
  Type TVar3;
  element_type *peVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view fmt;
  format_args args;
  Error local_230;
  Error local_208;
  Error local_1e0;
  anon_class_1_0_00000001 local_1b2;
  v10 local_1b1;
  v10 *local_1b0;
  Endpoint *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  Error local_180;
  Error local_158;
  Error local_130;
  allocator local_f1;
  undefined1 local_f0 [8];
  string requestUri;
  RequestHolder *requestHolder;
  Response *aResponse_local;
  Coap *this_local;
  undefined1 local_a0 [16];
  v10 *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_88;
  v10 *local_78;
  Endpoint *pEStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  Endpoint *pEStack_40;
  Coap **local_38;
  undefined1 *local_30;
  Coap **local_28;
  Coap **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  requestUri.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_f0,"UNKNOWN_URI",&local_f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  requestUri.field_2._8_8_ = RequestsCache::Match(&this->mRequestsCache,aResponse);
  if ((RequestHolder *)requestUri.field_2._8_8_ == (RequestHolder *)0x0) {
    bVar2 = Message::IsConfirmable(aResponse);
    if ((bVar2) || (bVar2 = Message::IsNonConfirmable(aResponse), bVar2)) {
      SendReset(&local_130,this,aResponse);
      IgnoreError(&local_130);
      Error::~Error(&local_130);
    }
  }
  else {
    peVar4 = std::
             __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)requestUri.field_2._8_8_);
    Message::GetUriPath(&local_158,peVar4,(string *)local_f0);
    Error::IgnoreError(&local_158);
    Error::~Error(&local_158);
    bVar2 = Message::IsResponse(aResponse);
    if (bVar2) {
      peVar4 = (element_type *)local_f0;
      Message::SetRequestUri(aResponse,(string *)peVar4);
    }
    TVar3 = Message::GetType(aResponse);
    switch(TVar3) {
    case kConfirmable:
      SendAck(&local_208,this,aResponse);
      IgnoreError(&local_208);
      Error::~Error(&local_208);
    case kNonConfirmable:
      uVar1 = requestUri.field_2._8_8_;
      Error::Error(&local_230);
      FinalizeTransaction(this,(RequestHolder *)uVar1,aResponse,&local_230);
      Error::~Error(&local_230);
      break;
    case kAcknowledgment:
      bVar2 = Message::IsEmpty(aResponse);
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)requestUri.field_2._8_8_);
        bVar2 = Message::IsConfirmable(peVar4);
        if (bVar2) {
          *(undefined1 *)(requestUri.field_2._8_8_ + 0x48) = 1;
        }
        bVar2 = std::operator==((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>
                                 *)(requestUri.field_2._8_8_ + 0x10),(nullptr_t)0x0);
        if (bVar2) {
          RequestsCache::Eliminate(&this->mRequestsCache,(RequestHolder *)requestUri.field_2._8_8_);
        }
      }
      else {
        bVar2 = Message::IsResponse(aResponse);
        if (bVar2) {
          peVar4 = std::
                   __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)requestUri.field_2._8_8_);
          bVar2 = Message::IsTokenEqual(aResponse,peVar4);
          uVar1 = requestUri.field_2._8_8_;
          if (bVar2) {
            Error::Error(&local_1e0);
            FinalizeTransaction(this,(RequestHolder *)uVar1,aResponse,&local_1e0);
            Error::~Error(&local_1e0);
          }
        }
      }
      break;
    case kReset:
      bVar2 = Message::IsEmpty(aResponse);
      uVar1 = requestUri.field_2._8_8_;
      if (bVar2) {
        HandleResponse::anon_class_1_0_00000001::operator()(&local_1b2);
        local_58 = &local_1b0;
        local_60 = &local_1b1;
        bVar5 = ::fmt::v10::operator()(local_60);
        local_1a8 = (Endpoint *)bVar5.size_;
        local_1b0 = (v10 *)bVar5.data_;
        ::fmt::v10::detail::
        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_68 = &local_1a0;
        local_78 = local_1b0;
        pEStack_70 = local_1a8;
        local_88._8_8_ = local_f0;
        local_50 = &local_78;
        local_90 = local_1b0;
        local_88._M_allocated_capacity = (size_type)local_1a8;
        local_48 = local_90;
        pEStack_40 = (Endpoint *)local_88._M_allocated_capacity;
        this_local = (Coap *)::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                       ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_88._8_8_,(v10 *)peVar4,local_68);
        local_30 = local_a0;
        local_38 = &this_local;
        local_18 = 0xd;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)local_88._M_allocated_capacity;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)local_38;
        local_28 = local_38;
        local_20 = local_38;
        local_10 = local_30;
        ::fmt::v10::vformat_abi_cxx11_(&local_1a0,local_90,fmt,args);
        Error::Error(&local_180,kAborted,&local_1a0);
        FinalizeTransaction(this,(RequestHolder *)uVar1,(Response *)0x0,&local_180);
        Error::~Error(&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_f0);
  return;
}

Assistant:

void Coap::HandleResponse(Response &aResponse)
{
    const RequestHolder *requestHolder = nullptr;
    std::string          requestUri    = "UNKNOWN_URI";

    requestHolder = mRequestsCache.Match(aResponse);
    if (requestHolder == nullptr)
    {
        if (aResponse.IsConfirmable() || aResponse.IsNonConfirmable())
        {
            IgnoreError(SendReset(aResponse));
        }
        ExitNow();
    }

    requestHolder->mRequest->GetUriPath(requestUri).IgnoreError();
    if (aResponse.IsResponse())
    {
        aResponse.SetRequestUri(requestUri);
    }

    switch (aResponse.GetType())
    {
    case Type::kReset:
        if (aResponse.IsEmpty())
        {
            FinalizeTransaction(*requestHolder, nullptr, ERROR_ABORTED("request to {} was reset by peer", requestUri));
        }

        // Silently ignore non-empty reset messages (RFC 7252, p. 4.2).
        break;

    case Type::kAcknowledgment:
        if (aResponse.IsEmpty())
        {
            // Empty acknowledgment.
            if (requestHolder->mRequest->IsConfirmable())
            {
                requestHolder->mAcknowledged = true;
            }

            // Remove the message if response is not expected, otherwise await response.
            if (requestHolder->mHandler == nullptr)
            {
                mRequestsCache.Eliminate(*requestHolder);
            }
        }
        else if (aResponse.IsResponse() && aResponse.IsTokenEqual(*requestHolder->mRequest))
        {
            // Piggybacked response.
            FinalizeTransaction(*requestHolder, &aResponse, ERROR_NONE);
        }

        // Silently ignore acknowledgments carrying requests (RFC 7252, p. 4.2)
        // or with no token match (RFC 7252, p. 5.3.2).
        break;

    case Type::kConfirmable:
        // Send empty ACK if it is a CON message.
        IgnoreError(SendAck(aResponse));

        // fall through

    case Type::kNonConfirmable:
        // Separate response.
        FinalizeTransaction(*requestHolder, &aResponse, ERROR_NONE);
        break;
    }

exit:
    return;
}